

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre_regex.cpp
# Opt level: O2

void __thiscall booster::regex::assign(regex *this,string *pattern,int flags)

{
  int iVar1;
  int iVar2;
  data *pdVar3;
  pcre *ppVar4;
  ostream *poVar5;
  regex_error *prVar6;
  allocator local_1c5;
  int offset;
  char *err_ptr;
  string local_1b8;
  string anchored;
  
  pdVar3 = (data *)operator_new(0x50);
  (pdVar3->expression)._M_dataplus._M_p = (pointer)&(pdVar3->expression).field_2;
  (pdVar3->expression)._M_string_length = 0;
  (pdVar3->expression).field_2._M_local_buf[0] = '\0';
  pdVar3->flags = 0;
  pdVar3->re = (pcre *)0x0;
  pdVar3->are = (pcre *)0x0;
  pdVar3->re_size = 0;
  pdVar3->are_size = 0;
  pdVar3->match_size = 0;
  copy_ptr<booster::regex::data>::reset(&this->d,pdVar3);
  std::__cxx11::string::_M_assign((string *)(this->d).ptr_);
  ((this->d).ptr_)->flags = flags;
  err_ptr = (char *)0x0;
  offset = 0;
  iVar2 = ((uint)flags >> 8 & 1) + (flags & 0x200U) * 4;
  ppVar4 = (pcre *)pcre_compile((pattern->_M_dataplus)._M_p,iVar2,&err_ptr,&offset,0);
  if (ppVar4 == (pcre *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&anchored);
    poVar5 = std::operator<<((ostream *)&anchored,"booster::regex:");
    poVar5 = std::operator<<(poVar5,err_ptr);
    poVar5 = std::operator<<(poVar5,", at offset ");
    std::ostream::operator<<((ostream *)poVar5,offset);
    prVar6 = (regex_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    regex_error::regex_error(prVar6,&local_1b8);
    __cxa_throw(prVar6,&regex_error::typeinfo,runtime_error::~runtime_error);
  }
  pdVar3 = (this->d).ptr_;
  pdVar3->re = ppVar4;
  iVar1 = pcre_fullinfo(ppVar4,0,1,&pdVar3->re_size);
  if (-1 < iVar1) {
    pdVar3 = (this->d).ptr_;
    iVar1 = pcre_fullinfo(pdVar3->re,0,2,&pdVar3->match_size);
    if (-1 < iVar1) {
      anchored._M_dataplus._M_p = (pointer)&anchored.field_2;
      anchored._M_string_length = 0;
      anchored.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::reserve((ulong)&anchored);
      std::__cxx11::string::append((char *)&anchored);
      std::__cxx11::string::append((string *)&anchored);
      std::__cxx11::string::append((char *)&anchored);
      ppVar4 = (pcre *)pcre_compile(anchored._M_dataplus._M_p,iVar2,&err_ptr,&offset,0);
      if (ppVar4 == (pcre *)0x0) {
        prVar6 = (regex_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_1b8,"booster::regex: Internal error",&local_1c5);
        regex_error::regex_error(prVar6,&local_1b8);
        __cxa_throw(prVar6,&regex_error::typeinfo,runtime_error::~runtime_error);
      }
      pdVar3 = (this->d).ptr_;
      pdVar3->are = ppVar4;
      iVar2 = pcre_fullinfo(ppVar4,0,1,&pdVar3->are_size);
      if (iVar2 == 0) {
        std::__cxx11::string::~string((string *)&anchored);
        return;
      }
      prVar6 = (regex_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_1b8,"booster::regex: Internal error",&local_1c5)
      ;
      regex_error::regex_error(prVar6,&local_1b8);
      __cxa_throw(prVar6,&regex_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  prVar6 = (regex_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&anchored,"booster::regex: Internal error",(allocator *)&local_1b8);
  regex_error::regex_error(prVar6,&anchored);
  __cxa_throw(prVar6,&regex_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void regex::assign(std::string const &pattern,int flags)
	{
		d.reset(new data());
		d->expression=pattern;
		d->flags = flags;
		char const *err_ptr = 0;
		int offset = 0;
		int pcre_flags = 0;
		if(flags & icase) {
			pcre_flags |= PCRE_CASELESS;
		}
		if(flags & utf8) {
			#ifndef PCRE_UTF8
			throw regex_error("PCRE Library does not support UTF-8 please upgrade");
			#else
			pcre_flags |= PCRE_UTF8;
			#endif
		}
		pcre *p=pcre_compile(pattern.c_str(),pcre_flags,&err_ptr,&offset,0);
		if(!p) {
			std::ostringstream ss;
			ss << "booster::regex:" << err_ptr <<", at offset "<<offset;
			throw regex_error(ss.str());
		}
		d->re = p;
		if(	pcre_fullinfo(d->re,NULL,PCRE_INFO_SIZE,&d->re_size) < 0
			|| pcre_fullinfo(d->re,NULL,PCRE_INFO_CAPTURECOUNT,&d->match_size) < 0)
		{
			throw regex_error("booster::regex: Internal error");
		}
		
		std::string anchored;
		anchored.reserve(pattern.size()+6);
		anchored+= "(?:";
		anchored+=pattern;
		anchored+=")\\z";

		p=pcre_compile(anchored.c_str(),pcre_flags,&err_ptr,&offset,0);
		if(!p) {
			throw regex_error("booster::regex: Internal error");
		}
		d->are = p;
		if(pcre_fullinfo(d->are,NULL,PCRE_INFO_SIZE,&d->are_size) != 0)
		{
			throw regex_error("booster::regex: Internal error");
		}
	}